

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool IR::Instr::HasSymUseInRange(StackSym *sym,Instr *instrBegin,Instr *instrEnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  Instr *pIVar5;
  bool bVar6;
  
  if (instrEnd == (Instr *)0x0) {
    pIVar5 = (Instr *)0x0;
  }
  else {
    pIVar5 = instrEnd->m_next;
  }
  bVar6 = pIVar5 != instrBegin;
  if (bVar6) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIVar4 = (Instr *)0x0;
    do {
      if ((pIVar4 != (Instr *)0x0) && (pIVar4->m_next != instrBegin)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xc23,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar2) goto LAB_004c07bc;
        *puVar3 = 0;
      }
      if (instrBegin == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xc25,"(instr)","instr");
        if (!bVar2) {
LAB_004c07bc:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      bVar2 = HasSymUse(instrBegin,sym);
      if (bVar2) {
        return bVar6;
      }
      bVar6 = instrBegin->m_next != pIVar5;
      pIVar4 = instrBegin;
      instrBegin = instrBegin->m_next;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

FOREACH_INSTR_IN_RANGE(instr, instrBegin, instrEnd)
    {
        Assert(instr);
        if (instr->HasSymUse(sym))
        {
            return true;
        }
    }